

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

void __thiscall
QNetworkRequest::setDecompressedSafetyCheckThreshold(QNetworkRequest *this,qint64 threshold)

{
  QNetworkRequestPrivate *pQVar1;
  QSharedDataPointer<QNetworkRequestPrivate> *in_RSI;
  
  pQVar1 = QSharedDataPointer<QNetworkRequestPrivate>::operator->(in_RSI);
  pQVar1->decompressedSafetyCheckThreshold = (qint64)in_RSI;
  return;
}

Assistant:

void QNetworkRequest::setDecompressedSafetyCheckThreshold(qint64 threshold)
{
    d->decompressedSafetyCheckThreshold = threshold;
}